

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

void remove_child(dl_t children_list,TreeNode *c)

{
  dl_el *pdVar1;
  dl_t _curr_dl;
  dl_el *_next;
  dl_el *_el;
  TreeNode *child;
  TreeNode *c_local;
  dl_t children_list_local;
  
  pdVar1 = children_list->first;
  do {
    _next = pdVar1;
    if (_next == (dl_el *)0x0) {
      return;
    }
    pdVar1 = _next->next;
  } while ((TreeNode *)_next[1].prev != c);
  dl_delete(children_list,_next);
  return;
}

Assistant:

void remove_child(dl_t children_list, TreeNode* c)
{
  TreeNode *child;
  dl_forall(TreeNode*, children_list, child) {
    if (child==c) {
      dl_delete_current();
      break;
    }
  } dl_endfor;
}